

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

int __thiscall kj::Directory::symlink(Directory *this,char *__from,char *__to)

{
  int iVar1;
  int extraout_EAX;
  ulong in_R9;
  Fault f;
  PathPtr linkpath_local;
  
  linkpath_local.parts.ptr = (String *)__from;
  linkpath_local.parts.size_ = (size_t)__to;
  iVar1 = (*(this->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x13])();
  if ((char)iVar1 == '\0') {
    if ((in_R9 & 1) == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x274,FAILED,(char *)0x0,
                 "\"symlink() returned null despite no preconditions\", linkpath",
                 (char (*) [49])"symlink() returned null despite no preconditions",&linkpath_local);
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x271,FAILED,(char *)0x0,"\"path already exsits\", linkpath",
                 (char (*) [20])"path already exsits",&linkpath_local);
    }
    _::Debug::Fault::~Fault(&f);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void Directory::symlink(PathPtr linkpath, StringPtr content, WriteMode mode) const {
  if (!trySymlink(linkpath, content, mode)) {
    if (has(mode, WriteMode::CREATE)) {
      KJ_FAIL_REQUIRE("path already exsits", linkpath) { break; }
    } else {
      // Shouldn't happen.
      KJ_FAIL_ASSERT("symlink() returned null despite no preconditions", linkpath) { break; }
    }
  }
}